

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O0

HighsInt Highs_qpCall(HighsInt num_col,HighsInt num_row,HighsInt num_nz,HighsInt q_num_nz,
                     HighsInt a_format,HighsInt q_format,HighsInt sense,double offset,
                     double *col_cost,double *col_lower,double *col_upper,double *row_lower,
                     double *row_upper,HighsInt *a_start,HighsInt *a_index,double *a_value,
                     HighsInt *q_start,HighsInt *q_index,double *q_value,double *col_value,
                     double *col_dual,double *row_value,double *row_dual,HighsInt *col_basis_status,
                     HighsInt *row_basis_status,HighsInt *model_status)

{
  HighsStatus HVar1;
  HighsSolution *pHVar2;
  HighsBasis *pHVar3;
  HighsModelStatus *pHVar4;
  HighsInfo *pHVar5;
  const_reference pvVar6;
  const_reference pvVar7;
  int in_ESI;
  int in_EDI;
  bool bVar8;
  bool bVar9;
  undefined4 in_stack_00000008;
  Highs *in_stack_00000010;
  long in_stack_00000068;
  long in_stack_00000070;
  long in_stack_00000078;
  long in_stack_00000080;
  long in_stack_00000088;
  long in_stack_00000090;
  HighsModelStatus *in_stack_00000098;
  HighsInt i_1;
  bool copy_row_basis;
  bool copy_row_dual;
  bool copy_row_value;
  HighsInt i;
  bool copy_col_basis;
  bool copy_col_dual;
  bool copy_col_value;
  HighsInfo *info;
  HighsBasis *basis;
  HighsSolution *solution;
  HighsStatus status;
  Highs highs;
  undefined1 in_stack_ffffffffffffacaf;
  undefined4 in_stack_ffffffffffffacb0;
  undefined4 in_stack_ffffffffffffacb4;
  Highs *in_stack_ffffffffffffacb8;
  byte local_52de;
  byte local_52db;
  Highs *in_stack_ffffffffffffad50;
  int local_5280;
  int local_5278;
  HighsStatus local_5250;
  allocator local_5239;
  string local_5238 [1808];
  double in_stack_ffffffffffffb4d8;
  HighsInt in_stack_ffffffffffffb4e4;
  HighsInt in_stack_ffffffffffffb4e8;
  HighsInt in_stack_ffffffffffffb4ec;
  HighsInt in_stack_ffffffffffffb4f0;
  HighsInt in_stack_ffffffffffffb4f4;
  Highs *in_stack_ffffffffffffb4f8;
  HighsInt in_stack_ffffffffffffb510;
  HighsInt in_stack_ffffffffffffb518;
  double *in_stack_ffffffffffffb520;
  double *in_stack_ffffffffffffb528;
  double *in_stack_ffffffffffffb530;
  double *in_stack_ffffffffffffb538;
  double *in_stack_ffffffffffffb540;
  HighsInt *in_stack_ffffffffffffb548;
  HighsInt *in_stack_ffffffffffffb550;
  double *in_stack_ffffffffffffb558;
  HighsInt *in_stack_ffffffffffffb560;
  HighsInt *in_stack_ffffffffffffb568;
  double *in_stack_ffffffffffffb570;
  HighsInt *in_stack_ffffffffffffb578;
  
  Highs::Highs(in_stack_ffffffffffffad50);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5238,"output_flag",&local_5239);
  Highs::setOptionValue
            (in_stack_ffffffffffffacb8,
             (string *)CONCAT44(in_stack_ffffffffffffacb4,in_stack_ffffffffffffacb0),
             (bool)in_stack_ffffffffffffacaf);
  std::__cxx11::string::~string(local_5238);
  std::allocator<char>::~allocator((allocator<char> *)&local_5239);
  *in_stack_00000098 = kMin;
  HVar1 = Highs::passModel(in_stack_ffffffffffffb4f8,in_stack_ffffffffffffb4f4,
                           in_stack_ffffffffffffb4f0,in_stack_ffffffffffffb4ec,
                           in_stack_ffffffffffffb4e8,in_stack_ffffffffffffb4e4,
                           in_stack_ffffffffffffb510,in_stack_ffffffffffffb518,
                           in_stack_ffffffffffffb4d8,in_stack_ffffffffffffb520,
                           in_stack_ffffffffffffb528,in_stack_ffffffffffffb530,
                           in_stack_ffffffffffffb538,in_stack_ffffffffffffb540,
                           in_stack_ffffffffffffb548,in_stack_ffffffffffffb550,
                           in_stack_ffffffffffffb558,in_stack_ffffffffffffb560,
                           in_stack_ffffffffffffb568,in_stack_ffffffffffffb570,
                           in_stack_ffffffffffffb578);
  if (HVar1 == kError) {
    local_5250 = kError;
  }
  else {
    local_5250 = Highs::run(in_stack_00000010);
    if (local_5250 == kOk) {
      pHVar2 = Highs::getSolution((Highs *)(local_5238 + 0x20));
      pHVar3 = Highs::getBasis((Highs *)(local_5238 + 0x20));
      pHVar4 = Highs::getModelStatus((Highs *)(local_5238 + 0x20));
      *in_stack_00000098 = *pHVar4;
      pHVar5 = Highs::getInfo((Highs *)(local_5238 + 0x20));
      bVar8 = false;
      if (in_stack_00000068 != 0) {
        bVar8 = (pHVar5->super_HighsInfoStruct).primal_solution_status != 0;
      }
      bVar9 = false;
      if (in_stack_00000070 != 0) {
        bVar9 = (pHVar5->super_HighsInfoStruct).dual_solution_status != 0;
      }
      local_52db = 0;
      if (in_stack_00000088 != 0) {
        local_52db = pHVar3->valid;
      }
      for (local_5278 = 0; local_5278 < in_EDI; local_5278 = local_5278 + 1) {
        if (bVar8) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pHVar2->col_value,(long)local_5278);
          *(value_type *)(in_stack_00000068 + (long)local_5278 * 8) = *pvVar6;
        }
        if (bVar9) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pHVar2->col_dual,(long)local_5278);
          *(value_type *)(in_stack_00000070 + (long)local_5278 * 8) = *pvVar6;
        }
        if ((local_52db & 1) != 0) {
          pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             (&pHVar3->col_status,(long)local_5278);
          *(uint *)(in_stack_00000088 + (long)local_5278 * 4) = (uint)*pvVar7;
        }
      }
      bVar8 = false;
      if (in_stack_00000078 != 0) {
        bVar8 = (pHVar5->super_HighsInfoStruct).primal_solution_status != 0;
      }
      bVar9 = false;
      if (in_stack_00000080 != 0) {
        bVar9 = (pHVar5->super_HighsInfoStruct).dual_solution_status != 0;
      }
      local_52de = 0;
      if (in_stack_00000090 != 0) {
        local_52de = pHVar3->valid;
      }
      for (local_5280 = 0; local_5280 < in_ESI; local_5280 = local_5280 + 1) {
        if (bVar8) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pHVar2->row_value,(long)local_5280);
          *(value_type *)(in_stack_00000078 + (long)local_5280 * 8) = *pvVar6;
        }
        if (bVar9) {
          pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&pHVar2->row_dual,(long)local_5280);
          *(value_type *)(in_stack_00000080 + (long)local_5280 * 8) = *pvVar6;
        }
        if ((local_52de & 1) != 0) {
          pvVar7 = std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::operator[]
                             (&pHVar3->row_status,(long)local_5280);
          *(uint *)(in_stack_00000090 + (long)local_5280 * 4) = (uint)*pvVar7;
        }
      }
    }
  }
  Highs::~Highs((Highs *)CONCAT44(in_stack_ffffffffffffacb4,in_stack_00000008));
  return local_5250;
}

Assistant:

HighsInt Highs_qpCall(
    const HighsInt num_col, const HighsInt num_row, const HighsInt num_nz,
    const HighsInt q_num_nz, const HighsInt a_format, const HighsInt q_format,
    const HighsInt sense, const double offset, const double* col_cost,
    const double* col_lower, const double* col_upper, const double* row_lower,
    const double* row_upper, const HighsInt* a_start, const HighsInt* a_index,
    const double* a_value, const HighsInt* q_start, const HighsInt* q_index,
    const double* q_value, double* col_value, double* col_dual,
    double* row_value, double* row_dual, HighsInt* col_basis_status,
    HighsInt* row_basis_status, HighsInt* model_status) {
  Highs highs;
  highs.setOptionValue("output_flag", false);
  *model_status = kHighsModelStatusNotset;
  HighsStatus status = highs.passModel(
      num_col, num_row, num_nz, q_num_nz, a_format, q_format, sense, offset,
      col_cost, col_lower, col_upper, row_lower, row_upper, a_start, a_index,
      a_value, q_start, q_index, q_value);
  if (status == HighsStatus::kError) return (HighsInt)status;

  status = highs.run();

  if (status == HighsStatus::kOk) {
    const HighsSolution& solution = highs.getSolution();
    const HighsBasis& basis = highs.getBasis();
    *model_status = (HighsInt)highs.getModelStatus();
    const HighsInfo& info = highs.getInfo();

    const bool copy_col_value =
        col_value != nullptr &&
        info.primal_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_col_dual =
        col_dual != nullptr &&
        info.dual_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_col_basis = col_basis_status != nullptr && basis.valid;
    for (HighsInt i = 0; i < num_col; i++) {
      if (copy_col_value) col_value[i] = solution.col_value[i];
      if (copy_col_dual) col_dual[i] = solution.col_dual[i];
      if (copy_col_basis) col_basis_status[i] = (HighsInt)basis.col_status[i];
    }

    const bool copy_row_value =
        row_value != nullptr &&
        info.primal_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_row_dual =
        row_dual != nullptr &&
        info.dual_solution_status != SolutionStatus::kSolutionStatusNone;
    const bool copy_row_basis = row_basis_status != nullptr && basis.valid;
    for (HighsInt i = 0; i < num_row; i++) {
      if (copy_row_value) row_value[i] = solution.row_value[i];
      if (copy_row_dual) row_dual[i] = solution.row_dual[i];
      if (copy_row_basis) row_basis_status[i] = (HighsInt)basis.row_status[i];
    }
  }
  return (HighsInt)status;
}